

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O2

void T_LoadScripts(MapData *map)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  FLineTrans *pFVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  FLineTrans *pFVar11;
  FLineTrans t;
  FScriptLoader parser;
  undefined4 local_2c;
  undefined4 uStack_28;
  FScriptLoader local_14;
  
  T_Init();
  bVar10 = FScriptLoader::ParseInfo(&local_14,map);
  pFVar7 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array;
  if ((((gameinfo.gametype - GAME_Doom < 2) &&
       (*(int *)(((level.info)->Translator).Chars + -0xc) == 0)) && (level.maptype == MAPTYPE_DOOM))
     && (0x110 < SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Count)) {
    pFVar11 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array + 0x110;
    if (bVar10) {
      pFVar11 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array + 0x10e;
    }
    if (pFVar11->special == 0x9e) {
      iVar8 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x10e].special;
      iVar9 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x10e].flags;
      uVar1 = *(undefined8 *)
               SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x10e].args;
      uVar2 = *(undefined8 *)
               (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x10e].args + 3);
      uStack_28 = (undefined4)
                  ((ulong)*(undefined8 *)
                           (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x10e]
                            .args + 1) >> 0x20);
      local_2c = (undefined4)((ulong)uVar1 >> 0x20);
      iVar5 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x110].special;
      iVar6 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x110].flags;
      uVar3 = *(undefined8 *)
               SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x110].args;
      uVar4 = *(undefined8 *)
               (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x110].args + 3);
      *(undefined8 *)
       (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x10e].args + 1) =
           *(undefined8 *)
            (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[0x110].args + 1);
      *(undefined8 *)(pFVar7[0x10e].args + 3) = uVar4;
      pFVar7[0x10e].special = iVar5;
      pFVar7[0x10e].flags = iVar6;
      *(undefined8 *)pFVar7[0x10e].args = uVar3;
      pFVar7[0x110].special = iVar8;
      pFVar7[0x110].flags = iVar9;
      *(undefined8 *)pFVar7[0x110].args = uVar1;
      *(ulong *)(pFVar7[0x110].args + 1) = CONCAT44(uStack_28,local_2c);
      *(undefined8 *)(pFVar7[0x110].args + 3) = uVar2;
    }
  }
  return;
}

Assistant:

void T_LoadScripts(MapData *map)
{
	FScriptLoader parser;
	
	T_Init();

	bool HasScripts = parser.ParseInfo(map);

	// Hack for Legacy compatibility: Since 272 is normally an MBF sky transfer we have to patch it.
	// It could be done with an additional translator but that would be sub-optimal for the user.
	// To handle this the default translator defines the proper Legacy type at index 270.
	// This code then then swaps 270 and 272 - but only if this is either Doom or Heretic and 
	// the default translator is being used.
	// Custom translators will not be patched.
	if ((gameinfo.gametype == GAME_Doom || gameinfo.gametype == GAME_Heretic) && level.info->Translator.IsEmpty() &&
		level.maptype == MAPTYPE_DOOM && SimpleLineTranslations.Size() > 272 && SimpleLineTranslations[272 - 2*HasScripts].special == FS_Execute)
	{
		FLineTrans t = SimpleLineTranslations[270];
		SimpleLineTranslations[270] = SimpleLineTranslations[272];
		SimpleLineTranslations[272] = t;
	}
}